

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O1

void __thiscall rengine::OpenGLRenderer::build(OpenGLRenderer *this,Node *n)

{
  vec2 vVar1;
  undefined8 uVar2;
  vec2 vVar3;
  uint uVar4;
  Element *pEVar5;
  vec2 vVar6;
  vec2 vVar7;
  vec2 vVar8;
  vec2 vVar9;
  bool bVar10;
  mat4 o;
  int i;
  uint uVar11;
  Node *pNVar12;
  long lVar13;
  undefined4 *puVar14;
  undefined8 *puVar15;
  mat4 *pmVar16;
  float *pfVar17;
  undefined8 *puVar18;
  mat4 *pmVar19;
  mat4 *this_00;
  Element *pEVar20;
  byte bVar21;
  vec2 *pvVar22;
  byte bVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  vec2 vVar34;
  vec2 vVar35;
  vec2 vVar36;
  float fVar37;
  float fVar38;
  vec3 v;
  float in_stack_fffffffffffffe48 [16];
  mat4 local_164;
  undefined8 local_120 [8];
  uint local_e0;
  float local_dc [2];
  mat4 old;
  vec3 vVar39;
  
  bVar23 = 0;
  bVar21 = n->field_0x30;
  if (0x40 < bVar21) {
    if (bVar21 - 0x41 < 2) {
      vVar3 = *(vec2 *)&n->field_0x34;
      fVar32 = vVar3.x;
      fVar29 = vVar3.y;
      vVar1 = *(vec2 *)((long)&n[1].super_SignalEmitter._vptr_SignalEmitter + 4);
      fVar27 = vVar1.x;
      fVar30 = vVar1.y;
      if (((fVar27 - fVar32 != 0.0) || (NAN(fVar27 - fVar32))) &&
         ((fVar30 - fVar29 != 0.0 || (NAN(fVar30 - fVar29))))) {
        if (bVar21 == 0x41) {
          if (*(float *)&n[1].m_child < 0.001) goto LAB_0012ff8d;
        }
        else if ((bVar21 == 0x42) && (n[1].m_parent == (Node *)0x0)) goto LAB_0012ff8d;
        pEVar20 = this->m_elements;
        uVar11 = this->m_elementIndex;
        pEVar20[uVar11].node = n;
        uVar4 = this->m_vertexIndex;
        pEVar20[uVar11].vboOffset = uVar4;
        pvVar22 = this->m_vertices + uVar4;
        if ((this->field_0x1f8 & 1) == 0) {
          vVar3.y = (this->m_m2d).m[4] * fVar32 + fVar29 * (this->m_m2d).m[5] + (this->m_m2d).m[7];
          vVar3.x = (this->m_m2d).m[0] * fVar32 + (this->m_m2d).m[1] * fVar29 + (this->m_m2d).m[3];
          *pvVar22 = vVar3;
          vVar35.x = (this->m_m2d).m[0] * fVar32 + (this->m_m2d).m[1] * fVar30 + (this->m_m2d).m[3];
          vVar35.y = (this->m_m2d).m[4] * fVar32 + (this->m_m2d).m[5] * fVar30 + (this->m_m2d).m[7];
          pvVar22[1] = vVar35;
          vVar36.x = (this->m_m2d).m[0] * fVar27 + (this->m_m2d).m[1] * fVar29 + (this->m_m2d).m[3];
          vVar36.y = (this->m_m2d).m[4] * fVar27 + (this->m_m2d).m[5] * fVar29 + (this->m_m2d).m[7];
          pvVar22[2] = vVar36;
          vVar1.y = fVar27 * (this->m_m2d).m[4] + fVar30 * (this->m_m2d).m[5] + (this->m_m2d).m[7];
          vVar1.x = (this->m_m2d).m[0] * fVar27 + (this->m_m2d).m[1] * fVar30 + (this->m_m2d).m[3];
          pvVar22[3] = vVar1;
        }
        else {
          v.x = (fVar32 + fVar27) * 0.5;
          v.y = (fVar29 + fVar30) * 0.5;
          v.z = 0.0;
          vVar39 = mat4::operator*(&this->m_m3d,v);
          pEVar20[uVar11].z = vVar39.z;
          projectQuad(this,vVar3,vVar1,pvVar22);
        }
        this->m_vertexIndex = this->m_vertexIndex + 4;
        this->m_elementIndex = this->m_elementIndex + 1;
        if ((this->field_0x1f8 & 2) != 0) {
          fVar27 = (this->m_layerBoundingBox).tl.x;
          fVar30 = (this->m_layerBoundingBox).tl.y;
          fVar32 = (this->m_layerBoundingBox).br.x;
          fVar29 = (this->m_layerBoundingBox).br.y;
          lVar13 = 0;
          do {
            vVar3 = pvVar22[lVar13];
            fVar24 = vVar3.x;
            if (fVar24 < fVar27) {
              (this->m_layerBoundingBox).tl.x = fVar24;
              fVar27 = fVar24;
            }
            fVar25 = vVar3.y;
            if (fVar25 < fVar30) {
              (this->m_layerBoundingBox).tl.y = fVar25;
              fVar30 = fVar25;
            }
            if (fVar32 < fVar24) {
              (this->m_layerBoundingBox).br.x = fVar24;
              fVar32 = fVar24;
            }
            if (fVar29 < fVar25) {
              (this->m_layerBoundingBox).br.y = fVar25;
              fVar29 = fVar25;
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 != 4);
        }
      }
    }
    else if (bVar21 == 0x43) {
      pEVar20 = this->m_elements;
      uVar11 = this->m_elementIndex;
      this->m_elementIndex = uVar11 + 1;
      pEVar20[uVar11].node = n;
      if ((this->field_0x1f8 & 1) != 0) {
        uVar2 = *(undefined8 *)((long)&n[1].super_SignalEmitter._vptr_SignalEmitter + 4);
        vVar39.x = ((float)uVar2 + (float)*(undefined8 *)&n->field_0x34) * 0.5;
        vVar39.y = ((float)((ulong)uVar2 >> 0x20) +
                   (float)((ulong)*(undefined8 *)&n->field_0x34 >> 0x20)) * 0.5;
        vVar39.z = 0.0;
        vVar39 = mat4::operator*(&this->m_m3d,vVar39);
        pEVar20[uVar11].z = vVar39.z;
      }
    }
LAB_0012ff8d:
    for (pNVar12 = n->m_child; pNVar12 != (Node *)0x0; pNVar12 = Node::sibling(pNVar12)) {
      build(this,pNVar12);
    }
    return;
  }
  if (3 < bVar21 - 2) {
    if (bVar21 == 1) {
      fVar27 = *(float *)&n[2].super_SignalEmitter.m_buckets;
      if (((fVar27 == 0.0) && (!NAN(fVar27))) || ((this->field_0x1f8 & 1) != 0)) {
        pEVar20 = (Element *)0x0;
      }
      else {
        this->field_0x1f8 = this->field_0x1f8 | 1;
        this->m_farPlane = *(float *)&n[2].super_SignalEmitter.m_buckets;
        pEVar5 = this->m_elements;
        uVar11 = this->m_elementIndex;
        this->m_elementIndex = uVar11 + 1;
        pEVar20 = pEVar5 + uVar11;
        pEVar5[uVar11].node = n;
        pEVar5[uVar11].z = 0.0;
        pEVar5[uVar11].field_0x1b = pEVar5[uVar11].field_0x1b | 0x20;
      }
      this_00 = &this->m_m2d;
      if ((this->field_0x1f8 & 1) != 0) {
        this_00 = &this->m_m3d;
      }
      pmVar16 = this_00;
      pfVar17 = local_dc;
      for (lVar13 = 0x11; lVar13 != 0; lVar13 = lVar13 + -1) {
        *pfVar17 = pmVar16->m[0];
        pmVar16 = (mat4 *)(pmVar16->m + 1);
        pfVar17 = pfVar17 + 1;
      }
      puVar14 = (undefined4 *)&n->field_0x34;
      puVar15 = local_120;
      for (lVar13 = 0x11; lVar13 != 0; lVar13 = lVar13 + -1) {
        *(undefined4 *)puVar15 = *puVar14;
        puVar14 = puVar14 + 1;
        puVar15 = (undefined8 *)((long)puVar15 + 4);
      }
      puVar15 = local_120;
      puVar18 = (undefined8 *)&stack0xfffffffffffffe48;
      for (lVar13 = 8; lVar13 != 0; lVar13 = lVar13 + -1) {
        *puVar18 = *puVar15;
        puVar15 = puVar15 + 1;
        puVar18 = puVar18 + 1;
      }
      o.type = local_e0;
      o.m[0] = in_stack_fffffffffffffe48[0];
      o.m[1] = in_stack_fffffffffffffe48[1];
      o.m[2] = in_stack_fffffffffffffe48[2];
      o.m[3] = in_stack_fffffffffffffe48[3];
      o.m[4] = in_stack_fffffffffffffe48[4];
      o.m[5] = in_stack_fffffffffffffe48[5];
      o.m[6] = in_stack_fffffffffffffe48[6];
      o.m[7] = in_stack_fffffffffffffe48[7];
      o.m[8] = in_stack_fffffffffffffe48[8];
      o.m[9] = in_stack_fffffffffffffe48[9];
      o.m[10] = in_stack_fffffffffffffe48[10];
      o.m[0xb] = in_stack_fffffffffffffe48[0xb];
      o.m[0xc] = in_stack_fffffffffffffe48[0xc];
      o.m[0xd] = in_stack_fffffffffffffe48[0xd];
      o.m[0xe] = in_stack_fffffffffffffe48[0xe];
      o.m[0xf] = in_stack_fffffffffffffe48[0xf];
      mat4::operator*(&local_164,this_00,o);
      pmVar16 = &local_164;
      pmVar19 = this_00;
      for (lVar13 = 0x11; lVar13 != 0; lVar13 = lVar13 + -1) {
        pmVar19->m[0] = pmVar16->m[0];
        pmVar16 = (mat4 *)((long)pmVar16 + (ulong)bVar23 * -8 + 4);
        pmVar19 = (mat4 *)((long)pmVar19 + (ulong)bVar23 * -8 + 4);
      }
      for (pNVar12 = n->m_child; pNVar12 != (Node *)0x0; pNVar12 = Node::sibling(pNVar12)) {
        build(this,pNVar12);
      }
      pfVar17 = local_dc;
      for (lVar13 = 0x11; lVar13 != 0; lVar13 = lVar13 + -1) {
        this_00->m[0] = *pfVar17;
        pfVar17 = pfVar17 + (ulong)bVar23 * -2 + 1;
        this_00 = (mat4 *)((long)this_00 + (ulong)bVar23 * -8 + 4);
      }
      if (pEVar20 == (Element *)0x0) {
        return;
      }
      this->field_0x1f8 = this->field_0x1f8 & 0xfe;
      this->m_farPlane = 0.0;
      *(uint *)&pEVar20->field_0x18 =
           *(uint *)&pEVar20->field_0x18 & 0xe0000000 |
           (int)((long)this->m_elements + ((ulong)this->m_elementIndex * 0x20 - (long)pEVar20) >> 5)
           - 1U & 0x1fffffff;
      return;
    }
    goto LAB_0012ff8d;
  }
  switch((uint)bVar21) {
  case 2:
    bVar10 = true;
    if (*(float *)&n->field_0x34 <= 1.0 && *(float *)&n->field_0x34 != 1.0) goto LAB_0012ffbc;
    if (bVar21 != 5) {
      if (bVar21 == 4) goto switchD_0012fd79_caseD_4;
      if (bVar21 == 3) goto switchD_0012fd79_caseD_3;
      goto switchD_0012fd79_default;
    }
    break;
  case 3:
switchD_0012fd79_caseD_3:
    bVar10 = true;
    if (*(int *)((long)&n[2].super_SignalEmitter._vptr_SignalEmitter + 4) != 0) goto LAB_0012ffbc;
    if (bVar21 != 5) {
      if (bVar21 == 4) goto switchD_0012fd79_caseD_4;
      goto switchD_0012fd79_default;
    }
    break;
  case 4:
switchD_0012fd79_caseD_4:
    bVar10 = true;
    if (*(int *)&n->field_0x34 != 0) goto LAB_0012ffbc;
    if (bVar21 != 5) goto switchD_0012fd79_default;
    break;
  case 5:
    break;
  default:
switchD_0012fd79_default:
    bVar10 = false;
    goto LAB_0012ffbc;
  }
  bVar10 = 0.0 < *(float *)((long)&n[1].m_parent + 4);
LAB_0012ffbc:
  bVar21 = this->field_0x1f8;
  fVar27 = (this->m_layerBoundingBox).tl.x;
  fVar30 = (this->m_layerBoundingBox).tl.y;
  fVar32 = (this->m_layerBoundingBox).br.x;
  fVar29 = (this->m_layerBoundingBox).br.y;
  if (bVar10) {
    this->field_0x1f8 = bVar21 | 2;
    pEVar5 = this->m_elements;
    uVar11 = this->m_elementIndex;
    this->m_elementIndex = uVar11 + 1;
    pEVar20 = pEVar5 + uVar11;
    pEVar5[uVar11].node = n;
    *(uint *)&pEVar5[uVar11].field_0x18 =
         ((byte)this->field_0x1f8 & 1) * 0x20000000 +
         (*(uint *)&pEVar5[uVar11].field_0x18 & 0x9fffffff) + 0x40000000;
    (this->m_layerBoundingBox).tl.x = INFINITY;
    (this->m_layerBoundingBox).tl.y = INFINITY;
    (this->m_layerBoundingBox).br.x = -INFINITY;
    (this->m_layerBoundingBox).br.y = -INFINITY;
  }
  else {
    pEVar20 = (Element *)0x0;
  }
  for (pNVar12 = n->m_child; pNVar12 != (Node *)0x0; pNVar12 = Node::sibling(pNVar12)) {
    build(this,pNVar12);
  }
  if (pEVar20 == (Element *)0x0) {
    return;
  }
  bVar21 = bVar21 & 2;
  this->field_0x1f8 = this->field_0x1f8 & 0xfd | bVar21;
  *(uint *)&pEVar20->field_0x18 =
       *(uint *)&pEVar20->field_0x18 & 0xe0000000 |
       (int)((long)this->m_elements + ((ulong)this->m_elementIndex * 0x20 - (long)pEVar20) >> 5) -
       1U & 0x1fffffff;
  uVar11 = this->m_vertexIndex;
  pEVar20->vboOffset = uVar11;
  old.m[0xf] = floorf((this->m_layerBoundingBox).tl.x);
  fVar24 = floorf((this->m_layerBoundingBox).tl.y);
  fVar25 = ceilf((this->m_layerBoundingBox).br.x);
  fVar26 = ceilf((this->m_layerBoundingBox).br.y);
  pvVar22 = this->m_vertices;
  vVar7.y = fVar24;
  vVar7.x = old.m[0xf];
  pvVar22[uVar11] = vVar7;
  pvVar22[(ulong)uVar11 + 1].x = old.m[0xf];
  pvVar22[(ulong)uVar11 + 1].y = fVar26;
  pvVar22[(ulong)uVar11 + 2].x = fVar25;
  pvVar22[(ulong)uVar11 + 2].y = fVar24;
  vVar8.y = fVar26;
  vVar8.x = fVar25;
  pvVar22[(ulong)uVar11 + 3] = vVar8;
  this->m_vertexIndex = this->m_vertexIndex + 4;
  if ((*(uint *)&n->field_0x30 & 0xfe) == 4) {
    fVar33 = (float)*(uint *)&n->field_0x34;
    fVar28 = fVar24 + -1.0;
    fVar31 = fVar26 + 1.0;
    fVar37 = old.m[0xf] - fVar33;
    fVar38 = fVar25 + fVar33;
    pvVar22[(ulong)uVar11 + 4].x = fVar37;
    pvVar22[(ulong)uVar11 + 4].y = fVar28;
    pvVar22[(ulong)uVar11 + 5].x = fVar37;
    pvVar22[(ulong)uVar11 + 5].y = fVar31;
    pvVar22[(ulong)uVar11 + 6].x = fVar38;
    pvVar22[(ulong)uVar11 + 6].y = fVar28;
    pvVar22[(ulong)uVar11 + 7].x = fVar38;
    pvVar22[(ulong)uVar11 + 7].y = fVar31;
    pvVar22[(ulong)uVar11 + 8].x = fVar37;
    pvVar22[(ulong)uVar11 + 8].y = fVar24 - fVar33;
    pvVar22[(ulong)uVar11 + 9].x = fVar37;
    pvVar22[(ulong)uVar11 + 9].y = fVar26 + fVar33;
    pvVar22[(ulong)uVar11 + 10].x = fVar38;
    pvVar22[(ulong)uVar11 + 10].y = fVar24 - fVar33;
    pvVar22[(ulong)uVar11 + 0xb].x = fVar38;
    pvVar22[(ulong)uVar11 + 0xb].y = fVar26 + fVar33;
    this->m_vertexIndex = this->m_vertexIndex + 8;
    if (n->field_0x30 == '\x05') {
      vVar6.y = fVar24 + -1.0;
      vVar6.x = old.m[0xf] + -1.0;
      pvVar22[(ulong)uVar11 + 0xc] = vVar6;
      pvVar22[(ulong)uVar11 + 0xd].x = old.m[0xf] + -1.0;
      pvVar22[(ulong)uVar11 + 0xd].y = fVar31;
      pvVar22[(ulong)uVar11 + 0xe].x = fVar25 + 1.0;
      pvVar22[(ulong)uVar11 + 0xe].y = fVar28;
      vVar9.y = fVar31;
      vVar9.x = fVar25 + 1.0;
      pvVar22[(ulong)uVar11 + 0xf] = vVar9;
    }
  }
  if (bVar21 != 0) {
    vVar3 = (this->m_layerBoundingBox).tl;
    fVar25 = vVar3.x;
    fVar26 = vVar3.y;
    fVar24 = fVar25;
    if (fVar25 <= fVar32) {
      fVar24 = fVar32;
    }
    vVar34 = (this->m_layerBoundingBox).br;
    if (fVar27 <= fVar25) {
      fVar25 = fVar27;
    }
    fVar32 = fVar26;
    if (fVar30 <= fVar26) {
      fVar32 = fVar30;
    }
    if (fVar26 <= fVar29) {
      fVar26 = fVar29;
    }
    fVar28 = vVar34.x;
    fVar27 = fVar28;
    if (fVar25 <= fVar28) {
      fVar27 = fVar25;
    }
    fVar29 = vVar34.y;
    fVar30 = fVar29;
    if (fVar32 <= fVar29) {
      fVar30 = fVar32;
    }
    if (fVar28 <= fVar24) {
      vVar34.y = 0.0;
      vVar34.x = fVar24;
    }
    fVar32 = vVar34.x;
    if (fVar29 <= fVar26) {
      fVar29 = fVar26;
    }
  }
  (this->m_layerBoundingBox).tl.x = fVar27;
  (this->m_layerBoundingBox).tl.y = fVar30;
  (this->m_layerBoundingBox).br.x = fVar32;
  (this->m_layerBoundingBox).br.y = fVar29;
  if ((this->field_0x1f8 & 1) == 0) {
    return;
  }
  uVar11 = *(uint *)&pEVar20->field_0x18 & 0x1fffffff;
  fVar27 = 0.0;
  lVar13 = 0;
  do {
    fVar27 = fVar27 + *(float *)((long)&pEVar20->z + lVar13);
    lVar13 = lVar13 + 0x20;
  } while ((ulong)uVar11 * 0x20 + 0x20 != lVar13);
  pEVar20->z = fVar27 / (float)uVar11;
  return;
}

Assistant:

inline void OpenGLRenderer::build(Node *n)
{
    switch (n->type()) {
    case Node::TextureNodeType:
    case Node::RectangleNodeType: {
        rect2d geometry = static_cast<RectangleNodeBase *>(n)->geometry();

        // Skip if empty..
        if (geometry.width() == 0 || geometry.height() == 0
            || (n->type() == Node::TextureNodeType && static_cast<TextureNode *>(n)->texture() == 0)
            || (n->type() == Node::RectangleNodeType && static_cast<RectangleNode *>(n)->color().w < RENGINE_RENDERER_ALPHA_THRESHOLD))
            break;

        Element *e = m_elements + m_elementIndex;
        e->node = n;
        e->vboOffset = m_vertexIndex;
        vec2 p1 = geometry.tl;
        vec2 p2 = geometry.br;
        vec2 *v = m_vertices + m_vertexIndex;

        // std::cout << " -- building rect from " << p1 << " " << p2 << " into " << m_vertices << " " << e << std::endl;

        if (m_render3d) {
            e->z = (m_m3d * vec3((p1 + p2) / 2.0f)).z;
            projectQuad(p1, p2, v);

        } else {
            v[0] = m_m2d * p1;
            v[1] = m_m2d * vec2(p1.x, p2.y);
            v[2] = m_m2d * vec2(p2.x, p1.y);
            v[3] = m_m2d * p2;
        }
        m_vertexIndex += 4;
        m_elementIndex += 1;

        // Add to the bounding box if we're in inside a layer
        if (m_layered) {
            for (int i=0; i<4; ++i)
                m_layerBoundingBox |= v[i];
            // std::cout << " ----> bounds: " << m_layerBoundingBox << std::endl;
        }

    } break;

    case Node::TransformNodeType: {
        TransformNode *tn = static_cast<TransformNode *>(n);

        Element *e = 0;

        if (tn->projectionDepth() && !m_render3d) {
            m_render3d = true;
            m_farPlane = tn->projectionDepth();
            e = m_elements + m_elementIndex++;
            e->node = n;
            e->z = 0;
            e->projection = true;
        }

        mat4 *m = m_render3d ? &m_m3d : &m_m2d;
        mat4 old = *m;
        *m = *m * tn->matrix();

        for (Node *c = n->child(); c; c = c->sibling())
            build(c);

        // restore previous state
        *m = old;
        if (e) {
            m_render3d = false;
            m_farPlane = 0;
            e->groupSize = (m_elements + m_elementIndex) - e - 1;
        }
    } return;

    // all layered node types take this code path
    case Node::ShadowNodeType:
    case Node::BlurNodeType:
    case Node::ColorFilterNodeType:
    case Node::OpacityNodeType: {

        bool useTexture =
            (n->type() == Node::OpacityNodeType && static_cast<OpacityNode *>(n)->opacity() < 1.0f)
            || (n->type() == Node::ColorFilterNodeType && !static_cast<ColorFilterNode *>(n)->colorMatrix().isIdentity())
            || (n->type() == Node::BlurNodeType && static_cast<BlurNode *>(n)->radius() > 0)
            || (n->type() == Node::ShadowNodeType && static_cast<ShadowNode *>(n)->color().w > 0);

        bool storedTextureed = m_layered;
        Element *e = 0;
        rect2d storedBox = m_layerBoundingBox;

        if (useTexture) {
            m_layered = true;
            e = m_elements + m_elementIndex++;
            e->node = n;
            e->projection = m_render3d;
            e->layered = true;
            const float inf = std::numeric_limits<float>::infinity();
            m_layerBoundingBox = rect2d(inf, inf, -inf, -inf);
        }
        // std::cout << " -- building layered node into " << e << std::endl;

        for (Node *c = n->child(); c; c = c->sibling())
            build(c);

        if (e) {
            m_layered = storedTextureed;
            e->groupSize = (m_elements + m_elementIndex) - e - 1;
            // std::cout << "groupSize of " << e << " is " << e->groupSize << " based on: " << m_elements << " " << m_elementIndex << " " << e << std::endl;
            e->vboOffset = m_vertexIndex;
            rect2d box = m_layerBoundingBox.aligned();
            vec2 *v = m_vertices + m_vertexIndex;
            v[0] = box.tl;
            v[1] = vec2(box.left(), box.bottom());
            v[2] = vec2(box.right(), box.top());
            v[3] = box.br;
            m_vertexIndex += 4;

            if (n->type() == Node::BlurNodeType || n->type() == Node::ShadowNodeType) {
                float radius = n->type() == Node::BlurNodeType
                               ? static_cast<BlurNode *>(n)->radius()
                               : static_cast<ShadowNode *>(n)->radius();
                float t1 = box.tl.y - 1;
                float b1 = box.br.y + 1;
                vec2 tlr = box.tl - vec2(radius);
                vec2 brr = box.br + vec2(radius);
                v[ 4] = vec2(tlr.x, t1);
                v[ 5] = vec2(tlr.x, b1);
                v[ 6] = vec2(brr.x, t1);
                v[ 7] = vec2(brr.x, b1);
                v[ 8] = vec2(tlr.x, tlr.y);
                v[ 9] = vec2(tlr.x, brr.y);
                v[10] = vec2(brr.x, tlr.y);
                v[11] = vec2(brr.x, brr.y);
                m_vertexIndex += 8;

                if (n->type() == Node::ShadowNodeType) {
                    v[12] = box.tl - 1.0;
                    v[13] = vec2(box.left() - 1, box.bottom() + 1);
                    v[14] = vec2(box.right() + 1, box.top() - 1);
                    v[15] = box.br + 1;
                }
            }

            // We're a nested layer, accumulate the layered bounding box into
            // the stored one..
            if (storedTextureed)
                storedBox |= m_layerBoundingBox;

            m_layerBoundingBox = storedBox;
            if (m_render3d) {
                // Let the opacity layer's z be the average of all its children..
                float z = 0;
                for (unsigned i=0; i<=e->groupSize; ++i)
                    z += (e+i)->z;
                e->z = z / e->groupSize;
            }
        }

    } return;

    case Node::RenderNodeType: {
        Element *e = m_elements + m_elementIndex++;
        e->node = n;
        rect2d geometry = static_cast<RectangleNodeBase *>(n)->geometry();
        vec2 p1 = geometry.tl;
        vec2 p2 = geometry.br;
        // This will "kinda" work. As long as our 3d support is based on back-
        // to-front ordering of the center of primitives, we might as well
        // order render nodes back-to-front as well. The usercase is a bit
        // broken though..
        if (m_render3d)
            e->z = (m_m3d * vec3((p1 + p2) / 2.0f)).z;
        break;
    }

    default:
        break;
    }

    for (Node *c = n->child(); c; c = c->sibling())
        build(c);


}